

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_nochannels(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  long in_RDI;
  __type_conflict2 _Var2;
  CHAR_DATA *victim;
  char buf [4608];
  char arg [4608];
  char *in_stack_ffffffffffffdbd8;
  ulong uVar3;
  char *in_stack_ffffffffffffdbe0;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  char *in_stack_ffffffffffffdbf0;
  char local_1218;
  int in_stack_ffffffffffffee2c;
  long in_stack_ffffffffffffee30;
  long in_stack_ffffffffffffee38;
  OBJ_DATA *in_stack_ffffffffffffee40;
  CHAR_DATA *in_stack_ffffffffffffee48;
  char *in_stack_ffffffffffffee50;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  one_argument(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  }
  else {
    pCVar1 = get_char_world(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    if (pCVar1 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    }
    else if (pCVar1->level < *(short *)(in_RDI + 0x138)) {
      uVar3 = pCVar1->comm[0];
      _Var2 = std::pow<int,int>(0,0x587094);
      if ((uVar3 & (long)_Var2) == 0) {
        _Var2 = std::pow<int,int>(0,0x587151);
        pCVar1->comm[0] = (long)_Var2 | pCVar1->comm[0];
        send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        sprintf(&stack0xffffffffffffdbe8,"$N revokes %s\'s channels.",pCVar1->name);
        wiznet(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,
               in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c);
      }
      else {
        _Var2 = std::pow<int,int>(0,0x5870b9);
        pCVar1->comm[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & pCVar1->comm[0];
        send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        sprintf(&stack0xffffffffffffdbe8,"$N restores channels to %s",pCVar1->name);
        wiznet(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,
               in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c);
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    }
  }
  return;
}

Assistant:

void do_nochannels(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Nochannel whom?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->level <= victim->level)
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (IS_SET(victim->comm, COMM_NOCHANNELS))
	{
		REMOVE_BIT(victim->comm, COMM_NOCHANNELS);

		send_to_char("The gods have restored your channel privileges.\n\r", victim);
		send_to_char("NOCHANNELS removed.\n\r", ch);

		sprintf(buf, "$N restores channels to %s", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
	else
	{
		SET_BIT(victim->comm, COMM_NOCHANNELS);

		send_to_char("The gods have revoked your channel privileges.\n\r", victim);
		send_to_char("NOCHANNELS set.\n\r", ch);

		sprintf(buf, "$N revokes %s's channels.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
}